

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAbc9Rpm(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  uint local_48;
  uint local_44;
  int fVeryVerbose;
  int fVerbose;
  int fUseOldAlgo;
  int fUseNaive;
  int nCutMax;
  int c;
  Gia_Man_t *pTemp;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  fUseOldAlgo = 0x10;
  bVar1 = false;
  bVar2 = false;
  local_44 = 0;
  local_48 = 0;
  Extra_UtilGetoptReset();
  do {
    iVar3 = Extra_UtilGetopt(argc,argv,"Cnavwh");
    if (iVar3 == -1) {
      if (pAbc->pGia == (Gia_Man_t *)0x0) {
        Abc_Print(-1,"Abc_CommandAbc9Rpm(): There is no AIG.\n");
        return 0;
      }
      if (bVar1) {
        _nCutMax = Gia_ManDupReplaceCut(pAbc->pGia);
      }
      else if (bVar2) {
        _nCutMax = Abs_RpmPerformOld(pAbc->pGia,local_44);
      }
      else {
        _nCutMax = Abs_RpmPerform(pAbc->pGia,fUseOldAlgo,local_44,local_48);
      }
      Abc_FrameUpdateGia(pAbc,_nCutMax);
      return 0;
    }
    switch(iVar3) {
    case 0x43:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-C\" should be followed by an integer.\n");
        goto LAB_002b7272;
      }
      fUseOldAlgo = atoi(argv[globalUtilOptind]);
      globalUtilOptind = globalUtilOptind + 1;
      if (fUseOldAlgo < 0) {
LAB_002b7272:
        Abc_Print(-2,"usage: &rpm [-C num] [-navwh]\n");
        Abc_Print(-2,"\t         performs structural reparametrization\n");
        Abc_Print(-2,"\t-C num : max cut size for testing range equivalence [default = %d]\n",
                  (ulong)(uint)fUseOldAlgo);
        pcVar4 = "no";
        if (bVar1) {
          pcVar4 = "yes";
        }
        Abc_Print(-2,"\t-n     : toggle using naive reparametrization [default = %s]\n",pcVar4);
        pcVar4 = "no";
        if (bVar2) {
          pcVar4 = "yes";
        }
        Abc_Print(-2,"\t-a     : toggle using old algorithm [default = %s]\n",pcVar4);
        pcVar4 = "no";
        if (local_44 != 0) {
          pcVar4 = "yes";
        }
        Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar4);
        pcVar4 = "no";
        if (local_48 != 0) {
          pcVar4 = "yes";
        }
        Abc_Print(-2,"\t-w     : toggle printing more verbose information [default = %s]\n",pcVar4);
        Abc_Print(-2,"\t-h     : print the command usage\n");
        return 1;
      }
      break;
    default:
      goto LAB_002b7272;
    case 0x61:
      bVar2 = (bool)(bVar2 ^ 1);
      break;
    case 0x68:
      goto LAB_002b7272;
    case 0x6e:
      bVar1 = (bool)(bVar1 ^ 1);
      break;
    case 0x76:
      local_44 = local_44 ^ 1;
      break;
    case 0x77:
      local_48 = local_48 ^ 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandAbc9Rpm( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern Gia_Man_t * Gia_ManDupReplaceCut( Gia_Man_t * p );
    Gia_Man_t * pTemp;
    int c, nCutMax   = 16;
    int fUseNaive    =  0;
    int fUseOldAlgo  =  0;
    int fVerbose     =  0;
    int fVeryVerbose =  0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Cnavwh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            nCutMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nCutMax < 0 )
                goto usage;
            break;
        case 'n':
            fUseNaive ^= 1;
            break;
        case 'a':
            fUseOldAlgo ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'w':
            fVeryVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Rpm(): There is no AIG.\n" );
        return 0;
    }
    if ( fUseNaive )
        pTemp = Gia_ManDupReplaceCut( pAbc->pGia );
    else if ( fUseOldAlgo )
        pTemp = Abs_RpmPerformOld( pAbc->pGia, fVerbose );
    else
        pTemp = Abs_RpmPerform( pAbc->pGia, nCutMax, fVerbose, fVeryVerbose );
    Abc_FrameUpdateGia( pAbc, pTemp );
    return 0;

usage:
    Abc_Print( -2, "usage: &rpm [-C num] [-navwh]\n" );
    Abc_Print( -2, "\t         performs structural reparametrization\n" );
    Abc_Print( -2, "\t-C num : max cut size for testing range equivalence [default = %d]\n", nCutMax );
    Abc_Print( -2, "\t-n     : toggle using naive reparametrization [default = %s]\n", fUseNaive? "yes": "no" );
    Abc_Print( -2, "\t-a     : toggle using old algorithm [default = %s]\n", fUseOldAlgo? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-w     : toggle printing more verbose information [default = %s]\n", fVeryVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}